

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

LY_ERR eval_predicate(lyxp_expr *exp,uint32_t *tok_idx,lyxp_set *set,uint32_t options,lyxp_axis axis
                     )

{
  uint32_t uVar1;
  uint32_t uVar2;
  bool bVar3;
  LY_ERR LVar4;
  int iVar5;
  int32_t iVar6;
  char *pcVar7;
  char *pcVar8;
  int local_110;
  LY_ERR ret___1;
  LY_ERR ret__;
  lyxp_set set2;
  ly_bool reverse_axis;
  int32_t pred_in_ctx;
  uint32_t orig_size;
  uint32_t orig_pos;
  uint32_t orig_exp;
  uint32_t i;
  LY_ERR rc;
  lyxp_axis axis_local;
  uint32_t options_local;
  lyxp_set *set_local;
  uint32_t *tok_idx_local;
  lyxp_expr *exp_local;
  
  bVar3 = false;
  memset(&ret___1,0,0x90);
  pcVar7 = "parsed";
  if ((options & 0x20) != 0) {
    pcVar7 = "skipped";
  }
  pcVar8 = lyxp_token2str(exp->tokens[*tok_idx]);
  ly_log_dbg(2,"%-27s %s %s[%u]","eval_predicate",pcVar7,pcVar8,(ulong)exp->tok_pos[*tok_idx]);
  *tok_idx = *tok_idx + 1;
  if ((options & 0x20) == 0) {
    if (set->type == LYXP_SET_NODE_SET) {
      iVar5 = set_sort(set);
      if (iVar5 != 0) {
        __assert_fail("!set_sort(set)",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                      ,0x1d61,
                      "LY_ERR eval_predicate(const struct lyxp_expr *, uint32_t *, struct lyxp_set *, uint32_t, enum lyxp_axis)"
                     );
      }
      if (set->used != 0) {
        if (axis < LYXP_AXIS_ATTRIBUTE) {
LAB_0021d235:
          bVar3 = true;
        }
        else if (axis - LYXP_AXIS_ATTRIBUTE < 7) {
LAB_0021d23b:
          bVar3 = false;
        }
        else {
          if (axis - LYXP_AXIS_PRECEDING < 2) goto LAB_0021d235;
          if (axis == LYXP_AXIS_SELF) goto LAB_0021d23b;
        }
        uVar1 = *tok_idx;
        if (bVar3) {
          local_110 = set->used + 1;
        }
        else {
          local_110 = 0;
        }
        pred_in_ctx = local_110;
        uVar2 = set->used;
        for (orig_pos = 0; orig_pos < set->used; orig_pos = orig_pos + 1) {
          set_init((lyxp_set *)&ret___1,set);
          set_insert_node((lyxp_set *)&ret___1,(set->val).nodes[orig_pos].node,
                          (set->val).nodes[orig_pos].pos,(set->val).nodes[orig_pos].type,0);
          iVar5 = 1;
          if (bVar3) {
            iVar5 = -1;
          }
          pred_in_ctx = iVar5 + pred_in_ctx;
          *tok_idx = uVar1;
          set2.ht._0_4_ = pred_in_ctx;
          set2.ht._4_4_ = uVar2;
          LVar4 = eval_expr_select(exp,tok_idx,LYXP_EXPR_NONE,(lyxp_set *)&ret___1,options);
          if ((LVar4 == LY_SUCCESS) && (set2.ctx_pos._1_1_ != '\0')) {
            set->not_found = '\x01';
            break;
          }
          if (LVar4 != LY_SUCCESS) {
            lyxp_set_free_content((lyxp_set *)&ret___1);
            return LVar4;
          }
          if (ret___1 == LY_EINVAL) {
            if ((long)ROUND((longdouble)set2._8_10_) == (ulong)(uint)pred_in_ctx) {
              set2._8_10_ = (BADTYPE)1;
            }
            else {
              set2._8_10_ = (BADTYPE)0;
            }
          }
          lyxp_set_cast((lyxp_set *)&ret___1,LYXP_SET_BOOLEAN);
          if (set2._8_1_ == '\0') {
            set_remove_node_none(set,orig_pos);
          }
        }
        set_remove_nodes_none(set);
        goto LAB_0021d675;
      }
    }
    else {
      if (set->type != LYXP_SET_SCNODE_SET) {
        ret___1 = LY_SUCCESS;
        set_fill_set((lyxp_set *)&ret___1,set);
        LVar4 = eval_expr_select(exp,tok_idx,LYXP_EXPR_NONE,(lyxp_set *)&ret___1,options);
        if (LVar4 != LY_SUCCESS) {
          lyxp_set_free_content((lyxp_set *)&ret___1);
          return LVar4;
        }
        lyxp_set_cast((lyxp_set *)&ret___1,LYXP_SET_BOOLEAN);
        if (set2._8_1_ == '\0') {
          lyxp_set_free_content(set);
        }
        lyxp_set_free_content((lyxp_set *)&ret___1);
        goto LAB_0021d675;
      }
      orig_pos = 0;
      while ((orig_pos < set->used &&
             (*(int *)((long)(set->val).nodes + (ulong)orig_pos * 0x18 + 0xc) != 2))) {
        orig_pos = orig_pos + 1;
      }
      if (orig_pos != set->used) {
        uVar1 = *tok_idx;
        iVar6 = set_scnode_new_in_ctx(set);
        for (orig_pos = 0; orig_pos < set->used; orig_pos = orig_pos + 1) {
          if (*(int *)((long)(set->val).nodes + (ulong)orig_pos * 0x18 + 0xc) == iVar6) {
            *(undefined4 *)((long)(set->val).nodes + (ulong)orig_pos * 0x18 + 0xc) = 2;
            *tok_idx = uVar1;
            LVar4 = eval_expr_select(exp,tok_idx,LYXP_EXPR_NONE,set,options);
            if ((LVar4 == LY_SUCCESS) && (set->not_found != '\0')) break;
            if (LVar4 != LY_SUCCESS) {
              return LVar4;
            }
            *(int32_t *)((long)(set->val).nodes + (ulong)orig_pos * 0x18 + 0xc) = iVar6;
          }
        }
        for (orig_pos = 0; orig_pos < set->used; orig_pos = orig_pos + 1) {
          if (*(int *)((long)(set->val).nodes + (ulong)orig_pos * 0x18 + 0xc) == 2) {
            *(undefined4 *)((long)(set->val).nodes + (ulong)orig_pos * 0x18 + 0xc) = 0;
          }
          else if (*(int *)((long)(set->val).nodes + (ulong)orig_pos * 0x18 + 0xc) == iVar6) {
            *(undefined4 *)((long)(set->val).nodes + (ulong)orig_pos * 0x18 + 0xc) = 2;
          }
        }
        goto LAB_0021d675;
      }
    }
  }
  LVar4 = eval_expr_select(exp,tok_idx,LYXP_EXPR_NONE,set,options | 0x20);
  if (LVar4 != LY_SUCCESS) {
    return LVar4;
  }
LAB_0021d675:
  if (exp->tokens[*tok_idx] == LYXP_TOKEN_BRACK2) {
    pcVar7 = "parsed";
    if ((options & 0x20) != 0) {
      pcVar7 = "skipped";
    }
    pcVar8 = lyxp_token2str(exp->tokens[*tok_idx]);
    ly_log_dbg(2,"%-27s %s %s[%u]","eval_predicate",pcVar7,pcVar8,(ulong)exp->tok_pos[*tok_idx]);
    *tok_idx = *tok_idx + 1;
    return LY_SUCCESS;
  }
  __assert_fail("exp->tokens[*tok_idx] == LYXP_TOKEN_BRACK2",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                0x1de3,
                "LY_ERR eval_predicate(const struct lyxp_expr *, uint32_t *, struct lyxp_set *, uint32_t, enum lyxp_axis)"
               );
}

Assistant:

static LY_ERR
eval_predicate(const struct lyxp_expr *exp, uint32_t *tok_idx, struct lyxp_set *set, uint32_t options, enum lyxp_axis axis)
{
    LY_ERR rc;
    uint32_t i, orig_exp, orig_pos, orig_size;
    int32_t pred_in_ctx;
    ly_bool reverse_axis = 0;
    struct lyxp_set set2 = {0};

    /* '[' */
    LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (options & LYXP_SKIP_EXPR ? "skipped" : "parsed"),
            lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
    ++(*tok_idx);

    if (options & LYXP_SKIP_EXPR) {
only_parse:
        rc = eval_expr_select(exp, tok_idx, 0, set, options | LYXP_SKIP_EXPR);
        LY_CHECK_RET(rc);
    } else if (set->type == LYXP_SET_NODE_SET) {
        /* we (possibly) need the set sorted, it can affect the result (if the predicate result is a number) */
        assert(!set_sort(set));

        /* empty set, nothing to evaluate */
        if (!set->used) {
            goto only_parse;
        }

        /* decide forward or reverse axis */
        switch (axis) {
        case LYXP_AXIS_ANCESTOR:
        case LYXP_AXIS_ANCESTOR_OR_SELF:
        case LYXP_AXIS_PRECEDING:
        case LYXP_AXIS_PRECEDING_SIBLING:
            reverse_axis = 1;
            break;
        case LYXP_AXIS_DESCENDANT:
        case LYXP_AXIS_DESCENDANT_OR_SELF:
        case LYXP_AXIS_FOLLOWING:
        case LYXP_AXIS_FOLLOWING_SIBLING:
        case LYXP_AXIS_PARENT:
        case LYXP_AXIS_CHILD:
        case LYXP_AXIS_SELF:
        case LYXP_AXIS_ATTRIBUTE:
            reverse_axis = 0;
            break;
        }

        orig_exp = *tok_idx;
        orig_pos = reverse_axis ? set->used + 1 : 0;
        orig_size = set->used;
        for (i = 0; i < set->used; ++i) {
            set_init(&set2, set);
            set_insert_node(&set2, set->val.nodes[i].node, set->val.nodes[i].pos, set->val.nodes[i].type, 0);

            /* remember the node context position for position() and context size for last() */
            orig_pos += reverse_axis ? -1 : 1;

            set2.ctx_pos = orig_pos;
            set2.ctx_size = orig_size;
            *tok_idx = orig_exp;

            rc = eval_expr_select(exp, tok_idx, 0, &set2, options);
            if (!rc && set2.not_found) {
                set->not_found = 1;
                break;
            }
            if (rc) {
                lyxp_set_free_content(&set2);
                return rc;
            }

            /* number is a proximity position */
            if (set2.type == LYXP_SET_NUMBER) {
                if ((long long)set2.val.num == orig_pos) {
                    set2.val.num = 1;
                } else {
                    set2.val.num = 0;
                }
            }
            lyxp_set_cast(&set2, LYXP_SET_BOOLEAN);

            /* predicate satisfied or not? */
            if (!set2.val.bln) {
                set_remove_node_none(set, i);
            }
        }
        set_remove_nodes_none(set);

    } else if (set->type == LYXP_SET_SCNODE_SET) {
        for (i = 0; i < set->used; ++i) {
            if (set->val.scnodes[i].in_ctx == LYXP_SET_SCNODE_ATOM_CTX) {
                /* there is a currently-valid node */
                break;
            }
        }
        /* empty set, nothing to evaluate */
        if (i == set->used) {
            goto only_parse;
        }

        orig_exp = *tok_idx;

        /* set special in_ctx to all the valid snodes */
        pred_in_ctx = set_scnode_new_in_ctx(set);

        /* use the valid snodes one-by-one */
        for (i = 0; i < set->used; ++i) {
            if (set->val.scnodes[i].in_ctx != pred_in_ctx) {
                continue;
            }
            set->val.scnodes[i].in_ctx = LYXP_SET_SCNODE_ATOM_CTX;

            *tok_idx = orig_exp;

            rc = eval_expr_select(exp, tok_idx, 0, set, options);
            if (!rc && set->not_found) {
                break;
            }
            LY_CHECK_RET(rc);

            set->val.scnodes[i].in_ctx = pred_in_ctx;
        }

        /* restore the state as it was before the predicate */
        for (i = 0; i < set->used; ++i) {
            if (set->val.scnodes[i].in_ctx == LYXP_SET_SCNODE_ATOM_CTX) {
                set->val.scnodes[i].in_ctx = LYXP_SET_SCNODE_ATOM_NODE;
            } else if (set->val.scnodes[i].in_ctx == pred_in_ctx) {
                set->val.scnodes[i].in_ctx = LYXP_SET_SCNODE_ATOM_CTX;
            }
        }

    } else {
        set2.type = LYXP_SET_NODE_SET;
        set_fill_set(&set2, set);

        rc = eval_expr_select(exp, tok_idx, 0, &set2, options);
        if (rc) {
            lyxp_set_free_content(&set2);
            return rc;
        }

        lyxp_set_cast(&set2, LYXP_SET_BOOLEAN);
        if (!set2.val.bln) {
            lyxp_set_free_content(set);
        }
        lyxp_set_free_content(&set2);
    }

    /* ']' */
    assert(exp->tokens[*tok_idx] == LYXP_TOKEN_BRACK2);
    LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (options & LYXP_SKIP_EXPR ? "skipped" : "parsed"),
            lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
    ++(*tok_idx);

    return LY_SUCCESS;
}